

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O0

RBTNode * rbt_left_right_iterator(RBTreeIterator *iter)

{
  RBTNode *pRVar1;
  RBTNode *came_from;
  RBTreeIterator *iter_local;
  
  if (iter->last_visited == (RBTNode *)0x0) {
    iter->last_visited = iter->rbt->root;
    while (iter->last_visited->left != &g_sentinel) {
      iter->last_visited = iter->last_visited->left;
    }
    iter_local = (RBTreeIterator *)iter->last_visited;
  }
  else if (iter->last_visited->right == &g_sentinel) {
    do {
      pRVar1 = iter->last_visited;
      iter->last_visited = iter->last_visited->parent;
      if (iter->last_visited == (RBTNode *)0x0) {
        iter->is_over = true;
        break;
      }
    } while (iter->last_visited->left != pRVar1);
    iter_local = (RBTreeIterator *)iter->last_visited;
  }
  else {
    iter->last_visited = iter->last_visited->right;
    while (iter->last_visited->left != &g_sentinel) {
      iter->last_visited = iter->last_visited->left;
    }
    iter_local = (RBTreeIterator *)iter->last_visited;
  }
  return (RBTNode *)iter_local;
}

Assistant:

static RBTNode *
rbt_left_right_iterator(RBTreeIterator *iter)
{
    if (iter->last_visited == NULL)
    {
        iter->last_visited = iter->rbt->root;
        while (iter->last_visited->left != RBTNIL)
            iter->last_visited = iter->last_visited->left;

        return iter->last_visited;
    }

    if (iter->last_visited->right != RBTNIL)
    {
        iter->last_visited = iter->last_visited->right;
        while (iter->last_visited->left != RBTNIL)
            iter->last_visited = iter->last_visited->left;

        return iter->last_visited;
    }

    for (;;)
    {
        RBTNode    *came_from = iter->last_visited;

        iter->last_visited = iter->last_visited->parent;
        if (iter->last_visited == NULL)
        {
            iter->is_over = true;
            break;
        }

        if (iter->last_visited->left == came_from)
            break;              /* came from left sub-tree, return current
                                 * node */

        /* else - came from right sub-tree, continue to move up */
    }

    return iter->last_visited;
}